

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status
wal_snapshot_open(filemgr *file,fdb_txn *txn,fdb_kvs_id_t kv_id,fdb_seqnum_t seqnum,
                 _fdb_key_cmp_info *key_cmp_info,snap_handle **shandle)

{
  pthread_spinlock_t *__lock;
  wal *pwVar1;
  list_elem *plVar2;
  fdb_custom_cmp_variable p_Var3;
  void *pvVar4;
  kvs_info *pkVar5;
  undefined7 uVar6;
  snap_handle *psVar7;
  list_elem *plVar8;
  list_elem *plVar9;
  bool bVar10;
  avl_node local_110;
  long local_f8;
  undefined8 local_f0;
  
  pwVar1 = file->wal;
  __lock = &pwVar1->lock;
  pthread_spin_lock(__lock);
  local_f0 = 0;
  local_f8 = kv_id + 1;
  psVar7 = (snap_handle *)avl_search_smaller(&pwVar1->wal_snapshot_tree,&local_110,_wal_snap_cmp);
  if ((((psVar7 == (snap_handle *)0x0) || (psVar7->id != kv_id)) ||
      ((psVar7->wal_ndocs).super___atomic_base<unsigned_long>._M_i == 0)) ||
     (psVar7->is_flushed == true)) {
    psVar7 = (snap_handle *)calloc(1,0xe0);
    if (psVar7 == (snap_handle *)0x0) {
      pthread_spin_unlock(__lock);
      return FDB_RESULT_ALLOC_FAIL;
    }
    psVar7->id = kv_id;
    LOCK();
    (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i = 0;
    UNLOCK();
    LOCK();
    (psVar7->wal_ndocs).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    psVar7->snap_txn = txn;
    uVar6 = *(undefined7 *)&(key_cmp_info->kvs_config).field_0x1;
    p_Var3 = (key_cmp_info->kvs_config).custom_cmp;
    pvVar4 = (key_cmp_info->kvs_config).custom_cmp_param;
    pkVar5 = key_cmp_info->kvs;
    (psVar7->cmp_info).kvs_config.create_if_missing = (key_cmp_info->kvs_config).create_if_missing;
    *(undefined7 *)&(psVar7->cmp_info).kvs_config.field_0x1 = uVar6;
    (psVar7->cmp_info).kvs_config.custom_cmp = p_Var3;
    (psVar7->cmp_info).kvs_config.custom_cmp_param = pvVar4;
    (psVar7->cmp_info).kvs = pkVar5;
    LOCK();
    (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i =
         (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i + 1;
    UNLOCK();
    _kvs_stat_get(file,psVar7->id,&psVar7->stat);
    bVar10 = seqnum == 0xffffffffffffffff;
    if (bVar10) {
      seqnum = fdb_kvs_get_seqnum(file,psVar7->id);
    }
    else {
      (psVar7->stat).wal_ndocs = 0;
      (psVar7->stat).wal_ndeletes = 0;
    }
    psVar7->seqnum = seqnum;
    psVar7->is_persisted_snapshot = !bVar10;
    avl_init(&psVar7->key_tree,&psVar7->cmp_info);
    avl_init(&psVar7->seq_tree,(void *)0x0);
    psVar7->global_txn = &file->global_txn;
    (psVar7->active_txn_list).head = (list_elem *)0x0;
    (psVar7->active_txn_list).tail = (list_elem *)0x0;
    plVar9 = (file->wal->txn_list).head;
    if (plVar9 != (list_elem *)0x0) {
      do {
        plVar2 = plVar9[1].prev;
        if ((fdb_txn *)plVar2 != &file->global_txn) {
          plVar8 = (list_elem *)calloc(1,0x18);
          plVar8[1].prev = plVar2->next;
          list_push_front(&psVar7->active_txn_list,plVar8);
        }
        plVar9 = plVar9->next;
      } while (plVar9 != (list_elem *)0x0);
    }
  }
  else if ((psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i == 0) {
    psVar7->snap_txn = txn;
    uVar6 = *(undefined7 *)&(key_cmp_info->kvs_config).field_0x1;
    p_Var3 = (key_cmp_info->kvs_config).custom_cmp;
    pvVar4 = (key_cmp_info->kvs_config).custom_cmp_param;
    pkVar5 = key_cmp_info->kvs;
    (psVar7->cmp_info).kvs_config.create_if_missing = (key_cmp_info->kvs_config).create_if_missing;
    *(undefined7 *)&(psVar7->cmp_info).kvs_config.field_0x1 = uVar6;
    (psVar7->cmp_info).kvs_config.custom_cmp = p_Var3;
    (psVar7->cmp_info).kvs_config.custom_cmp_param = pvVar4;
    (psVar7->cmp_info).kvs = pkVar5;
    LOCK();
    (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i =
         (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i + 1;
    UNLOCK();
    _kvs_stat_get(file,psVar7->id,&psVar7->stat);
    bVar10 = seqnum == 0xffffffffffffffff;
    if (bVar10) {
      seqnum = fdb_kvs_get_seqnum(file,psVar7->id);
    }
    else {
      (psVar7->stat).wal_ndocs = 0;
      (psVar7->stat).wal_ndeletes = 0;
    }
    psVar7->seqnum = seqnum;
    psVar7->is_persisted_snapshot = !bVar10;
    avl_init(&psVar7->key_tree,&psVar7->cmp_info);
    avl_init(&psVar7->seq_tree,(void *)0x0);
    psVar7->global_txn = &file->global_txn;
    (psVar7->active_txn_list).head = (list_elem *)0x0;
    (psVar7->active_txn_list).tail = (list_elem *)0x0;
    plVar9 = (file->wal->txn_list).head;
    if (plVar9 != (list_elem *)0x0) {
      do {
        plVar2 = plVar9[1].prev;
        if ((fdb_txn *)plVar2 != &file->global_txn) {
          plVar8 = (list_elem *)calloc(1,0x18);
          plVar8[1].prev = plVar2->next;
          list_push_front(&psVar7->active_txn_list,plVar8);
        }
        plVar9 = plVar9->next;
      } while (plVar9 != (list_elem *)0x0);
    }
  }
  else {
    LOCK();
    (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i =
         (psVar7->ref_cnt_kvs).super___atomic_base<unsigned_short>._M_i + 1;
    UNLOCK();
  }
  pthread_spin_unlock(__lock);
  *shandle = psVar7;
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snapshot_open(struct filemgr *file,
                             fdb_txn *txn,
                             fdb_kvs_id_t kv_id,
                             fdb_seqnum_t seqnum,
                             _fdb_key_cmp_info *key_cmp_info,
                             struct snap_handle **shandle)
{
    struct wal *_wal = file->wal;
    struct snap_handle *_shandle;

    spin_lock(&_wal->lock);
    _shandle = _wal_get_latest_snapshot(_wal, kv_id);
    if (!_shandle || // No item exist in WAL for this KV Store
        !atomic_get_uint64_t(&_shandle->wal_ndocs) || // Empty snapshot
        _shandle->is_flushed) { // Latest snapshot has read-write barrier
        // This can happen when a new snapshot is attempted and WAL was flushed
        // and no mutations after WAL flush - the snapshot exists solely for
        // existing open snapshot iterators
        _shandle = _wal_snapshot_create(kv_id, 0, 0);
        if (!_shandle) { // LCOV_EXCL_START
            spin_unlock(&_wal->lock);
            return FDB_RESULT_ALLOC_FAIL;
        } // LCOV_EXCL_STOP
        // This snapshot is not inserted into global shared tree
        _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
        DBG("%s Persisted snapshot taken at %" _F64 " for kv id %" _F64 "\n",
            file->filename, _shandle->seqnum, kv_id);
    } else { // Take a snapshot of the latest WAL state for this KV Store
        if (_wal_snap_is_immutable(_shandle)) { // existing snapshot still open
            atomic_incr_uint16_t(&_shandle->ref_cnt_kvs); // ..just Clone it
        } else { // make this snapshot of the WAL immutable..
            _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
            DBG("%s Snapshot init %" _F64 " - %" _F64 " taken at %"
                _F64 " for kv id %" _F64 "\n",
                file->filename, _shandle->snap_stop_idx,
                _shandle->snap_tag_idx, _shandle->seqnum, kv_id);
        }
    }
    spin_unlock(&_wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}